

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

char * linenoiseNoTTY(void)

{
  int iVar1;
  void *pvVar2;
  int c;
  char *oldval;
  size_t maxlen;
  size_t len;
  char *line;
  
  len = 0;
  maxlen = 0;
  oldval = (char *)0x0;
  do {
    pvVar2 = (void *)len;
    if ((char *)maxlen == oldval) {
      if (oldval == (char *)0x0) {
        oldval = (char *)0x10;
      }
      oldval = (char *)((long)oldval << 1);
      pvVar2 = realloc((void *)len,(size_t)oldval);
      if (pvVar2 == (void *)0x0) {
        if (len != 0) {
          free((void *)len);
        }
        return (char *)0x0;
      }
    }
    len = (size_t)pvVar2;
    iVar1 = fgetc(_stdin);
    if ((iVar1 == -1) || (iVar1 == 10)) {
      if ((iVar1 == -1) && (maxlen == 0)) {
        free((void *)len);
        line = (char *)0x0;
      }
      else {
        *(undefined1 *)(len + maxlen) = 0;
        line = (char *)len;
      }
      return line;
    }
    *(char *)(len + maxlen) = (char)iVar1;
    maxlen = maxlen + 1;
  } while( true );
}

Assistant:

static char *linenoiseNoTTY(void) {
    char *line = NULL;
    size_t len = 0, maxlen = 0;

    while(1) {
        if (len == maxlen) {
            if (maxlen == 0) maxlen = 16;
            maxlen *= 2;
            char *oldval = line;
            line = realloc(line,maxlen);
            if (line == NULL) {
                if (oldval) free(oldval);
                return NULL;
            }
        }
        int c = fgetc(stdin);
        if (c == EOF || c == '\n') {
            if (c == EOF && len == 0) {
                free(line);
                return NULL;
            } else {
                line[len] = '\0';
                return line;
            }
        } else {
            line[len] = c;
            len++;
        }
    }
}